

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::StateMachine::OnSSDPResponse(StateMachine *this,ParsedURL *url)

{
  ostringstream *this_00;
  pointer pGVar1;
  char *__s1;
  uint uVar2;
  int iVar3;
  OutputWorker *this_01;
  bool *pbVar4;
  ulong uVar5;
  GatewayEndpoint gateway;
  LogStringBuffer local_1b8;
  
  pGVar1 = (this->GatewayEndpoints).
           super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  pbVar4 = &pGVar1->Completed;
  __s1 = (url->FullURL)._M_dataplus._M_p;
  uVar2 = (uint)(((long)(this->GatewayEndpoints).
                        super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1) / 200);
  while( true ) {
    if ((~((int)uVar2 >> 0x1f) & uVar2) == uVar5) {
      if (DAT_0019e060 < 3) {
        this_00 = &local_1b8.LogStream;
        local_1b8.ChannelName = ModuleLogger;
        local_1b8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&DAT_0019e090);
        std::operator<<((ostream *)this_00,"Learned of gateway endpoint via SSDP: ");
        std::operator<<((ostream *)this_00,(string *)url);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
      GatewayEndpoint::GatewayEndpoint((GatewayEndpoint *)&local_1b8);
      ParsedURL::operator=((ParsedURL *)&local_1b8,url);
      std::vector<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>::
      push_back(&this->GatewayEndpoints,(value_type *)&local_1b8);
      BeginGatewayXMLRequest
                (this,(int)(((long)(this->GatewayEndpoints).
                                   super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->GatewayEndpoints).
                                  super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 200) + -1);
      GatewayEndpoint::~GatewayEndpoint((GatewayEndpoint *)&local_1b8);
      return;
    }
    iVar3 = strcasecmp(__s1,(((GatewayEndpoint *)(pbVar4 + -0xc0))->URL).FullURL._M_dataplus._M_p);
    if (iVar3 == 0) break;
    uVar5 = uVar5 + 1;
    pbVar4 = pbVar4 + 200;
  }
  if (*pbVar4 != false) {
    return;
  }
  *(int *)(pbVar4 + -0x18) = 3;
  if ((((shared_ptr<tonk::gateway::HTTPRequester> *)(pbVar4 + -0x10))->
      super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  BeginGatewayXMLRequest(this,(int)uVar5);
  return;
}

Assistant:

void StateMachine::OnSSDPResponse(const ParsedURL& url)
{
    const int gatewayCount = (int)GatewayEndpoints.size();

    // Find it if it is already in the list
    for (int gatewayIndex = 0; gatewayIndex < gatewayCount; ++gatewayIndex)
    {
        auto& gateway = GatewayEndpoints[gatewayIndex];

        // If it is already known:
        if (gateway.URL == url)
        {
            if (gateway.Completed) {
                return;
            }

            //ModuleLogger.Debug("Gateway already known - Requesting gateway descriptor again: ", url.FullURL);

            // If a gateway is advertised again, attempt to query its descriptor
            // to handle the case where we rejoined the same LAN
            gateway.RetriesRemaining = protocol::kPortMappingRetries;

            // If a request is not in progress:
            if (nullptr == gateway.Requester) {
                // Start a request now for XML descriptor
                BeginGatewayXMLRequest(gatewayIndex);
            }

            return;
        }
    }

    ModuleLogger.Info("Learned of gateway endpoint via SSDP: ", url.FullURL);

    GatewayEndpoint gateway;
    gateway.URL = url;

    GatewayEndpoints.push_back(gateway);
    const int addedGatewayIndex = (int)GatewayEndpoints.size() - 1;

    BeginGatewayXMLRequest(addedGatewayIndex);
}